

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_analyzer.cc
# Opt level: O0

FlowDecl * __thiscall AnalyzerFlow::flow_decl(AnalyzerFlow *this)

{
  FILE *__stream;
  DeclType DVar1;
  char *pcVar2;
  Decl *this_00;
  undefined8 uVar3;
  string *in_RDI;
  Decl *decl;
  ID *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffbc;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  __stream = _stderr;
  if (FLAGS_pac_debug) {
    pcVar2 = ID::Name((ID *)0x11c1ac);
    fprintf(__stream,"Getting flow_decl for %s\n",pcVar2);
  }
  if (in_RDI[3]._M_string_length == 0) {
    this_00 = Decl::LookUpDecl(in_stack_ffffffffffffff98);
    if ((this_00 != (Decl *)0x0) && (DVar1 = Decl::decl_type(this_00), DVar1 == FLOW)) {
      in_RDI[3]._M_string_length = (size_type)this_00;
    }
    if (in_RDI[3]._M_string_length == 0) {
      uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffffb8);
      uVar3 = __cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      Exception::Exception
                ((Exception *)in_stack_ffffffffffffffc0,
                 (Object *)CONCAT44(in_stack_ffffffffffffffbc,uVar4),in_RDI);
      __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
    }
  }
  return (FlowDecl *)in_RDI[3]._M_string_length;
}

Assistant:

FlowDecl* AnalyzerFlow::flow_decl()
	{
	DEBUG_MSG("Getting flow_decl for %s\n", type_id_->Name());
	if ( ! flow_decl_ )
		{
		Decl* decl = Decl::LookUpDecl(type_id_);
		if ( decl && decl->decl_type() == Decl::FLOW )
			flow_decl_ = static_cast<FlowDecl*>(decl);
		if ( ! flow_decl_ )
			{
			throw Exception(this, "cannot find the flow declaration");
			}
		}
	return flow_decl_;
	}